

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

void __thiscall duckdb::Serializer::WriteValue<float>(Serializer *this,vector<float,_true> *vec)

{
  pointer pfVar1;
  float *item;
  pointer pfVar2;
  
  (**(code **)(*(long *)this + 0x40))
            (this,(long)(vec->super_vector<float,_std::allocator<float>_>).
                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(vec->super_vector<float,_std::allocator<float>_>).
                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2);
  pfVar1 = (vec->super_vector<float,_std::allocator<float>_>).
           super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pfVar2 = (vec->super_vector<float,_std::allocator<float>_>).
                super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_start; pfVar2 != pfVar1; pfVar2 = pfVar2 + 1) {
    (**(code **)(*(long *)this + 200))(*pfVar2,this);
  }
  (**(code **)(*(long *)this + 0x48))(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}